

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.cc
# Opt level: O2

void __thiscall
SDL2pp::Surface::BlitScaled
          (Surface *this,Optional<Rect> *srcrect,Surface *dst,Optional<Rect> *dstrect)

{
  SDL_Surface *pSVar1;
  int iVar2;
  value_type *pvVar3;
  Exception *this_00;
  SDL_Rect *pSVar4;
  SDL_Rect tmpdstrect;
  
  if ((dstrect->super___optional_storage<SDL2pp::Rect,_true>).__engaged_ == true) {
    pvVar3 = sdl2pp_libcpp_optional::optional<SDL2pp::Rect>::operator*(dstrect);
    tmpdstrect.x = (pvVar3->super_SDL_Rect).x;
    tmpdstrect.y = (pvVar3->super_SDL_Rect).y;
    tmpdstrect.w = (pvVar3->super_SDL_Rect).w;
    tmpdstrect.h = (pvVar3->super_SDL_Rect).h;
  }
  pSVar1 = this->surface_;
  if ((srcrect->super___optional_storage<SDL2pp::Rect,_true>).__engaged_ == true) {
    pvVar3 = sdl2pp_libcpp_optional::optional<SDL2pp::Rect>::operator*(srcrect);
  }
  else {
    pvVar3 = (value_type *)0x0;
  }
  pSVar4 = &tmpdstrect;
  if ((dstrect->super___optional_storage<SDL2pp::Rect,_true>).__engaged_ == false) {
    pSVar4 = (SDL_Rect *)(undefined1 *)0x0;
  }
  iVar2 = SDL_UpperBlitScaled(pSVar1,pvVar3,dst->surface_,pSVar4);
  if (iVar2 == 0) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x50);
  Exception::Exception(this_00,"SDL_BlitScaled");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Surface::BlitScaled(const Optional<Rect>& srcrect, Surface& dst, const Optional<Rect>& dstrect) {
	SDL_Rect tmpdstrect; // 4th argument is non-const; does it modify rect?
	if (dstrect)
		tmpdstrect = *dstrect;
	if (SDL_BlitScaled(surface_, srcrect ? &*srcrect : nullptr, dst.Get(), dstrect ? &tmpdstrect : nullptr) != 0)
		throw Exception("SDL_BlitScaled");
}